

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_CCtx_params *in_RDI;
  ZSTD_CCtx_params *cctxParams;
  undefined4 uStack0000000000000010;
  undefined4 uStack0000000000000014;
  undefined4 uStack0000000000000018;
  undefined4 uStack000000000000001c;
  
  memset(in_RDI,0,0x78);
  *(ZSTD_CCtx_params **)&in_RDI->cParams = cctxParams;
  (in_RDI->cParams).hashLog = uStack0000000000000010;
  (in_RDI->cParams).searchLog = uStack0000000000000014;
  (in_RDI->cParams).searchLength = uStack0000000000000018;
  (in_RDI->cParams).targetLength = uStack000000000000001c;
  (in_RDI->cParams).strategy = cParams.windowLog;
  in_RDI->compressionLevel = 3;
  (in_RDI->fParams).contentSizeFlag = 1;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    memset(&cctxParams, 0, sizeof(cctxParams));
    cctxParams.cParams = cParams;
    cctxParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;  /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(cParams));
    cctxParams.fParams.contentSizeFlag = 1;
    return cctxParams;
}